

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf.cpp
# Opt level: O3

void __thiscall
ins_ekf::InsEkf::InsEkf
          (InsEkf *this,Vector3d *imu_offset,Vector4d *imu_orientation,Vector3d *gps_offset,
          VectorXd *initial_state,double gps_rate)

{
  Matrix<double,_5,_1,_0,_5,_1> *pMVar1;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_> *pPVar6;
  DenseStorage<double,_11,_11,_1,_0> *pDVar7;
  undefined1 auVar8 [16];
  PointerType ptr;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *pCVar9;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar10;
  double *pdVar11;
  long lVar12;
  char *__function;
  ActualDstType actualDst;
  long lVar13;
  long lVar14;
  Matrix<double,_15,_15,_0,_15,_15> *pMVar15;
  uint uVar16;
  int iVar21;
  uint uVar23;
  undefined1 auVar17 [16];
  uint uVar22;
  uint uVar25;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar26;
  undefined8 uVar27;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> local_a8;
  Vector3d *local_80;
  Scalar local_78;
  Scalar local_70;
  Matrix<double,_5,_1,_0,_5,_1> local_68;
  Scalar local_40;
  Scalar local_38;
  long lVar24;
  
  this->accel_noise = 0.001;
  this->accel_rw = 0.001;
  this->gyro_noise = 0.00013;
  this->gyro_rw = 0.0001;
  this->gps_update_rate_ = gps_rate;
  local_a8.m_xpr = &local_68;
  local_a8.m_row = 0;
  local_a8.m_col = 1;
  local_a8.m_currentBlockRows = 1;
  local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[0] =
       0.1;
  local_70 = 0.1;
  local_80 = gps_offset;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (&local_a8,&local_70);
  local_78 = 0.1;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar9,&local_78);
  local_38 = 0.2;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar9,&local_38);
  local_40 = 0.03;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::operator_
                     (pCVar9,&local_40);
  if ((pCVar9->m_currentBlockRows + pCVar9->m_row == 5) && (pCVar9->m_col == 1)) {
    pMVar1 = pCVar9->m_xpr;
    (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
    array[4] = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
               m_data.array[4];
    dVar3 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
            array[0];
    dVar4 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
            array[1];
    dVar5 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.m_data.
            array[3];
    (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
    array[2] = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>).m_storage.
               m_data.array[2];
    (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
    array[3] = dVar5;
    (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
    array[0] = dVar3;
    (this->Q_gps_).super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
    array[1] = dVar4;
    if ((local_a8.m_currentBlockRows + local_a8.m_row == 5) && (local_a8.m_col == 1)) {
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [1] = 0.0;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [2] = 4.94065645841247e-324;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [3] = 4.94065645841247e-324;
      local_a8.m_xpr = (Matrix<double,_5,_1,_0,_5,_1> *)0x0;
      local_70 = 0.0;
      local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array
      [0] = (double)&local_a8;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_68,
                           &local_70);
      local_78 = 9.81;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                          (pCVar10,&local_78);
      if ((pCVar10->m_currentBlockRows + pCVar10->m_row == 3) && (pCVar10->m_col == 1)) {
        pMVar2 = pCVar10->m_xpr;
        (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2] =
             (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array[2];
        dVar3 = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[1];
        (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[0] =
             (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
             .array[0];
        (this->gravity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[1] = dVar3;
        if (((long)local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                   m_data.array[3] +
             (long)local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
                   m_data.array[1] == 3) &&
           (local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
            array[2] == 4.94065645841247e-324)) {
          this->is_stationary_ = false;
          (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[2] =
               (imu_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
          dVar3 = (imu_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                  m_storage.m_data.array[1];
          (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[0] =
               (imu_offset->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0];
          (this->imu_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[1] = dVar3;
          dVar3 = (imu_orientation->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
                  m_storage.m_data.array[0];
          dVar4 = (imu_orientation->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
                  m_storage.m_data.array[1];
          dVar5 = (imu_orientation->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
                  m_storage.m_data.array[3];
          (this->imu_orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[2] =
               (imu_orientation->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).
               m_storage.m_data.array[2];
          (this->imu_orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[3] = dVar5;
          (this->imu_orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[0] = dVar3;
          (this->imu_orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1] = dVar4;
          (this->gps_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[2] =
               (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
          dVar3 = (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
                  .m_data.array[1];
          (this->gps_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[0] =
               (local_80->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0];
          (this->gps_offset_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
          .m_data.array[1] = dVar3;
          if ((initial_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
              m_storage.m_rows != 0xf) {
            __assert_fail("initial_state.size() == s_I(SI::NUM_STATES)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/KWoiceshyn[P]ins_ekf/src/ins_ekf.cpp"
                          ,0x14,
                          "ins_ekf::InsEkf::InsEkf(const Eigen::Vector3d &, const Eigen::Vector4d &, const Eigen::Vector3d &, Eigen::VectorXd, double)"
                         );
          }
          pdVar11 = (initial_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          local_a8.m_xpr = (Matrix<double,_5,_1,_0,_5,_1> *)*pdVar11;
          local_a8.m_row = (Index)pdVar11[1];
          local_a8.m_col = (Index)pdVar11[2];
          RPYToQuat((Vector4d *)&local_68,(Vector3d *)&local_a8);
          (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[2] =
               local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
               m_data.array[2];
          (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[3] =
               local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
               m_data.array[3];
          (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[0] =
               local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
               m_data.array[0];
          (this->orientation_).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1] =
               local_68.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
               m_data.array[1];
          if (5 < (initial_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows) {
            pdVar11 = (initial_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      ).m_storage.m_data;
            dVar3 = pdVar11[4];
            (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[0] = pdVar11[3];
            (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[1] = dVar3;
            (this->position_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
            .m_data.array[2] = pdVar11[5];
            if (8 < (initial_state->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows) {
              pMVar15 = &this->P_;
              pdVar11 = (initial_state->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                        m_data;
              dVar3 = pdVar11[7];
              (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] = pdVar11[6];
              (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1] = dVar3;
              (this->velocity_).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[2] = pdVar11[8];
              lVar14 = 0;
              memset(&this->bias_g_,0,0x738);
              auVar8 = _DAT_001104d0;
              auVar18 = _DAT_001104c0;
              pdVar11 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.
                        m_storage.m_data.array + 0x31;
              lVar12 = 0;
              do {
                lVar13 = 0;
                auVar17 = auVar18;
                do {
                  bVar26 = SUB164(auVar17 ^ auVar8,4) == -0x80000000 &&
                           SUB164(auVar17 ^ auVar8,0) < -0x7ffffffd;
                  if (bVar26) {
                    uVar27 = 0x4024000000000000;
                    if (lVar14 != lVar13) {
                      uVar27 = 0;
                    }
                    *(undefined8 *)((long)pdVar11 + lVar13 + -8) = uVar27;
                  }
                  if (bVar26) {
                    uVar27 = 0x4024000000000000;
                    if (lVar14 + -8 != lVar13) {
                      uVar27 = 0;
                    }
                    *(undefined8 *)((long)pdVar11 + lVar13) = uVar27;
                  }
                  auVar19 = _DAT_001104c0;
                  lVar24 = auVar17._8_8_;
                  auVar17._0_8_ = auVar17._0_8_ + 2;
                  auVar17._8_8_ = lVar24 + 2;
                  lVar13 = lVar13 + 0x10;
                } while (lVar13 != 0x20);
                lVar12 = lVar12 + 1;
                lVar14 = lVar14 + 8;
                pdVar11 = pdVar11 + 0xf;
              } while (lVar12 != 3);
              lVar12 = 0;
              do {
                iVar21 = (int)((ulong)lVar12 >> 0x20);
                uVar16 = -(uint)((int)lVar12 == auVar19._0_4_);
                uVar22 = -(uint)(iVar21 == auVar19._4_4_);
                uVar23 = -(uint)((int)lVar12 == auVar19._8_4_);
                uVar25 = -(uint)(iVar21 == auVar19._12_4_);
                *(uint *)(pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>)
                         .m_storage.m_data.array = uVar22 & uVar16 & 0xd2f1a9fc;
                *(uint *)((long)(pMVar15->
                                super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>).
                                m_storage.m_data.array + 4) = uVar16 & uVar22 & 0x3f80624d;
                *(uint *)((pMVar15->super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>
                          ).m_storage.m_data.array + 1) = uVar25 & uVar23 & 0xd2f1a9fc;
                *(uint *)((long)(pMVar15->
                                super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>).
                                m_storage.m_data.array + 0xc) = uVar23 & uVar25 & 0x3f80624d;
                lVar12 = lVar12 + 1;
                pMVar15 = (Matrix<double,_15,_15,_0,_15,_15> *)
                          ((pMVar15->
                           super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>).
                           m_storage.m_data.array + 0xf);
              } while (lVar12 != 2);
              (this->P_).super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.m_storage.
              m_data.array[0x20] = 0.03;
              pdVar11 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.
                        m_storage.m_data.array + 0x61;
              lVar12 = 0;
              lVar14 = 0;
              do {
                lVar13 = 0;
                auVar18 = auVar19;
                do {
                  bVar26 = SUB164(auVar18 ^ auVar8,4) == -0x80000000 &&
                           SUB164(auVar18 ^ auVar8,0) < -0x7ffffffd;
                  if (bVar26) {
                    uVar27 = 0x3fb999999999999a;
                    if (lVar12 != lVar13) {
                      uVar27 = 0;
                    }
                    *(undefined8 *)((long)pdVar11 + lVar13 + -8) = uVar27;
                  }
                  if (bVar26) {
                    uVar27 = 0x3fb999999999999a;
                    if (lVar12 + -8 != lVar13) {
                      uVar27 = 0;
                    }
                    *(undefined8 *)((long)pdVar11 + lVar13) = uVar27;
                  }
                  auVar17 = _DAT_001104c0;
                  lVar24 = auVar18._8_8_;
                  auVar18._0_8_ = auVar18._0_8_ + 2;
                  auVar18._8_8_ = lVar24 + 2;
                  lVar13 = lVar13 + 0x10;
                } while (lVar13 != 0x20);
                lVar14 = lVar14 + 1;
                lVar12 = lVar12 + 8;
                pdVar11 = pdVar11 + 0xf;
              } while (lVar14 != 3);
              pdVar11 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.
                        m_storage.m_data.array + 0x91;
              lVar12 = 0;
              lVar14 = 0;
              do {
                lVar13 = 0;
                auVar19 = auVar17;
                do {
                  bVar26 = SUB164(auVar19 ^ auVar8,4) == -0x80000000 &&
                           SUB164(auVar19 ^ auVar8,0) < -0x7ffffffd;
                  if (bVar26) {
                    uVar27 = 0x3e7ad7f29abcaf48;
                    if (lVar12 != lVar13) {
                      uVar27 = 0;
                    }
                    *(undefined8 *)((long)pdVar11 + lVar13 + -8) = uVar27;
                  }
                  if (bVar26) {
                    uVar27 = 0x3e7ad7f29abcaf48;
                    if (lVar12 + -8 != lVar13) {
                      uVar27 = 0;
                    }
                    *(undefined8 *)((long)pdVar11 + lVar13) = uVar27;
                  }
                  auVar18 = _DAT_001104c0;
                  lVar24 = auVar19._8_8_;
                  auVar19._0_8_ = auVar19._0_8_ + 2;
                  auVar19._8_8_ = lVar24 + 2;
                  lVar13 = lVar13 + 0x10;
                } while (lVar13 != 0x20);
                lVar14 = lVar14 + 1;
                lVar12 = lVar12 + 8;
                pdVar11 = pdVar11 + 0xf;
              } while (lVar14 != 3);
              pdVar11 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,_15,_15,_0,_15,_15>_>.
                        m_storage.m_data.array + 0xc1;
              lVar12 = 0;
              lVar14 = 0;
              do {
                lVar13 = 0;
                auVar20 = auVar18;
                do {
                  bVar26 = SUB164(auVar20 ^ auVar8,4) == -0x80000000 &&
                           SUB164(auVar20 ^ auVar8,0) < -0x7ffffffd;
                  if (bVar26) {
                    uVar27 = 0x3e45798ee2308c3a;
                    if (lVar12 != lVar13) {
                      uVar27 = 0;
                    }
                    *(undefined8 *)((long)pdVar11 + lVar13 + -8) = uVar27;
                  }
                  if (bVar26) {
                    uVar27 = 0x3e45798ee2308c3a;
                    if (lVar12 + -8 != lVar13) {
                      uVar27 = 0;
                    }
                    *(undefined8 *)((long)pdVar11 + lVar13) = uVar27;
                  }
                  lVar24 = auVar20._8_8_;
                  auVar20._0_8_ = auVar20._0_8_ + 2;
                  auVar20._8_8_ = lVar24 + 2;
                  lVar13 = lVar13 + 0x10;
                } while (lVar13 != 0x20);
                lVar14 = lVar14 + 1;
                lVar12 = lVar12 + 8;
                pdVar11 = pdVar11 + 0xf;
              } while (lVar14 != 3);
              pDVar7 = &(this->last_measurements_).
                        super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage;
              (pDVar7->m_data).array[8] = 0.0;
              (pDVar7->m_data).array[9] = 0.0;
              pDVar7 = &(this->last_measurements_).
                        super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage;
              (pDVar7->m_data).array[6] = 0.0;
              (pDVar7->m_data).array[7] = 0.0;
              pDVar7 = &(this->last_measurements_).
                        super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage;
              (pDVar7->m_data).array[4] = 0.0;
              (pDVar7->m_data).array[5] = 0.0;
              pDVar7 = &(this->last_measurements_).
                        super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage;
              (pDVar7->m_data).array[2] = 0.0;
              (pDVar7->m_data).array[3] = 0.0;
              pPVar6 = &(this->last_measurements_).
                        super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>;
              (pPVar6->m_storage).m_data.array[0] = 0.0;
              (pPVar6->m_storage).m_data.array[1] = 0.0;
              (this->last_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,_11,_1,_0,_11,_1>_>.m_storage.m_data.array
              [10] = 0.0;
              return;
            }
          }
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
      }
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
      ;
      goto LAB_001037a8;
    }
  }
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 5, 1>>::finished() [MatrixType = Eigen::Matrix<double, 5, 1>]"
  ;
LAB_001037a8:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

InsEkf::InsEkf(const Eigen::Vector3d& imu_offset, const Eigen::Vector4d& imu_orientation, const Eigen::Vector3d& gps_offset, Eigen::VectorXd initial_state, double gps_rate):
            imu_offset_{imu_offset},
            imu_orientation_{imu_orientation},
            gps_offset_{gps_offset},
            gps_update_rate_{gps_rate},
            Q_gps_{(Eigen::Matrix<double, 5, 1>() << 0.1, 0.1, 0.1, 0.2, 0.03).finished()},
            gravity_{(Eigen::Matrix<double, 3, 1>() << 0.0, 0.0, 9.81).finished()},
            is_stationary_{false}
    {

        assert(initial_state.size() == s_I(SI::NUM_STATES));
        orientation_ = RPYToQuat(initial_state.segment(s_I(SI::roll), 3));
        position_ = initial_state.segment(s_I(SI::x), 3);
        velocity_ = initial_state.segment(s_I(SI::Vx), 3);
        bias_g_.setZero();
        bias_a_.setZero();

        // initialize state covariance matrix
        P_.setZero();
        P_.block(s_I(SI::x), s_I(SI::x), 3, 3) = 10.0 * Eigen::Matrix3d::Identity(); // xyz
        P_.block(s_I(SI::roll), s_I(SI::roll), 2 , 2) = 8e-3 * Eigen::Matrix2d::Identity(); // roll, pitch
        P_(s_I(SI::yaw), s_I(SI::yaw)) = 3e-2; // yaw
        P_.block(s_I(SI::Vx), s_I(SI::Vx), 3 , 3) = 0.1 * Eigen::Matrix3d::Identity(); // Vxyz
        P_.block(s_I(SI::biasGp), s_I(SI::biasGp), 3, 3) = 1e-7 * Eigen::Matrix3d::Identity(); // biasGpqr
        P_.block(s_I(SI::biasAx), s_I(SI::biasAx), 3, 3) = 1e-8 * Eigen::Matrix3d::Identity(); // biasAxyz

        last_measurements_.setZero();
    }